

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O2

int mbedtls_ssl_handshake_client_step(mbedtls_ssl_context *ssl)

{
  mbedtls_key_exchange_type_t mVar1;
  mbedtls_ecp_group_id mVar2;
  mbedtls_x509_crt *pmVar3;
  mbedtls_ssl_config *pmVar4;
  uchar *puVar5;
  int *piVar6;
  mbedtls_ecp_group_id *pmVar7;
  mbedtls_ssl_session *pmVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uint5 uVar11;
  uchar uVar12;
  byte bVar13;
  ushort uVar14;
  ushort uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  mbedtls_pk_type_t type;
  mbedtls_pk_type_t mVar19;
  uint uVar20;
  mbedtls_ssl_key_cert *pmVar21;
  mbedtls_pk_context *pmVar22;
  size_t sVar23;
  mbedtls_ecp_curve_info *pmVar24;
  uchar *puVar25;
  mbedtls_md_info_t *pmVar26;
  mbedtls_ssl_ciphersuite_t *pmVar27;
  time_t tVar28;
  int *piVar29;
  size_t sVar30;
  ushort *puVar31;
  ulong uVar32;
  uint uVar33;
  size_t sVar34;
  mbedtls_md_type_t mVar35;
  uint uVar36;
  char *pcVar37;
  mbedtls_mpi *X;
  ushort *end;
  ulong uVar38;
  uint *puVar39;
  long lVar40;
  uchar *puVar41;
  uchar *puVar42;
  char **ppcVar43;
  mbedtls_ssl_handshake_params *pmVar44;
  ushort *puVar45;
  uchar *puVar46;
  long lVar47;
  long lVar48;
  mbedtls_sha1_context *hash_00;
  ulong uVar49;
  bool bVar50;
  ulong uStackY_1b0;
  undefined8 in_stack_fffffffffffffe58;
  undefined4 uVar52;
  undefined8 uVar51;
  undefined8 in_stack_fffffffffffffe60;
  undefined4 uVar53;
  uchar *local_178;
  ushort *local_170;
  ushort *local_168;
  uchar *local_160;
  uchar *local_158;
  uchar *local_150;
  char *local_148;
  char *local_140;
  mbedtls_sha1_context mbedtls_sha1;
  mbedtls_md5_context mbedtls_md5;
  uchar hash [64];
  
  uVar53 = (undefined4)((ulong)in_stack_fffffffffffffe60 >> 0x20);
  uVar52 = (undefined4)((ulong)in_stack_fffffffffffffe58 >> 0x20);
  iVar17 = -0x7100;
  if (ssl->state == 0x10) {
    return -0x7100;
  }
  if (ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) {
    return -0x7100;
  }
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
             ,0xc00,"client state: %d");
  iVar16 = mbedtls_ssl_flush_output(ssl);
  if (iVar16 != 0) {
    return iVar16;
  }
  if ((((ssl->conf->field_0x164 & 2) != 0) && (ssl->handshake->retransmit_state == '\x01')) &&
     (iVar16 = mbedtls_ssl_resend(ssl), iVar16 != 0)) {
    return iVar16;
  }
  uVar49 = (ulong)(uint)ssl->state;
  switch(uVar49) {
  case 0:
    ssl->state = 1;
    return 0;
  case 1:
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x278,"=> write client hello");
    pmVar4 = ssl->conf;
    if (pmVar4->f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x27c,"no RNG provided");
      return -0x7400;
    }
    if (ssl->renego_status == 0) {
      uVar14._0_1_ = pmVar4->min_major_ver;
      uVar14._1_1_ = pmVar4->min_minor_ver;
      uVar11 = CONCAT14(uVar14._1_1_,(uint)(uVar14 & 0xff));
      ssl->major_ver = (int)(ulong)uVar11;
      ssl->minor_ver = (int)((ulong)uVar11 >> 0x20);
    }
    if (pmVar4->max_major_ver == 0) {
      pcVar37 = 
      "configured max major version is invalid, consider using mbedtls_ssl_config_defaults()";
      iVar16 = 1;
      iVar18 = 0x28b;
      goto LAB_00179155;
    }
    puVar41 = ssl->out_msg;
    mbedtls_ssl_write_version
              ((uint)pmVar4->max_major_ver,(uint)pmVar4->max_minor_ver,
               *(uint *)&pmVar4->field_0x164 >> 1 & 1,puVar41 + 4);
    uVar51 = CONCAT44(uVar52,(uint)puVar41[5]);
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x29e,"client hello, max version: [%d:%d]",(ulong)puVar41[4],uVar51);
    pmVar44 = ssl->handshake;
    if (((ssl->conf->field_0x164 & 2) == 0) || (pmVar44->verify_cookie == (uchar *)0x0)) {
      tVar28 = time((time_t *)0x0);
      uVar20 = (uint)tVar28;
      *(uint *)pmVar44->randbytes =
           uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 | uVar20 << 0x18;
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x260,"client hello, current time: %lu",tVar28,uVar51);
      iVar17 = (*ssl->conf->f_rng)(ssl->conf->p_rng,pmVar44->randbytes + 4,0x1c);
      if (iVar17 != 0) {
        pcVar37 = "ssl_generate_random";
        iVar16 = 0x2a2;
        goto LAB_0017912d;
      }
      pmVar44 = ssl->handshake;
    }
    uVar51 = *(undefined8 *)pmVar44->randbytes;
    uVar9 = *(undefined8 *)(pmVar44->randbytes + 8);
    uVar10 = *(undefined8 *)(pmVar44->randbytes + 0x18);
    *(undefined8 *)(puVar41 + 0x16) = *(undefined8 *)(pmVar44->randbytes + 0x10);
    *(undefined8 *)(puVar41 + 0x1e) = uVar10;
    *(undefined8 *)(puVar41 + 6) = uVar51;
    *(undefined8 *)(puVar41 + 0xe) = uVar9;
    mbedtls_debug_print_buf
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x2a7,"client hello, random bytes",puVar41 + 6,0x20);
    pmVar8 = ssl->session_negotiate;
    sVar23 = pmVar8->id_len;
    if (sVar23 - 0x21 < 0xffffffffffffffef) {
      sVar23 = 0;
      if (ssl->renego_status == 0) {
LAB_0017835f:
        if ((pmVar8->ticket != (uchar *)0x0) && (pmVar8->ticket_len != 0)) {
          sVar23 = 0x20;
          iVar17 = (*ssl->conf->f_rng)(ssl->conf->p_rng,pmVar8->id,0x20);
          if (iVar17 != 0) {
            return iVar17;
          }
          ssl->session_negotiate->id_len = 0x20;
        }
      }
    }
    else {
      if (ssl->renego_status == 0) {
        if (ssl->handshake->resume == 0) {
          sVar23 = 0;
        }
        goto LAB_0017835f;
      }
      sVar23 = 0;
    }
    puVar41[0x26] = (uchar)sVar23;
    for (sVar34 = 0; sVar23 != sVar34; sVar34 = sVar34 + 1) {
      puVar41[sVar34 + 0x27] = ssl->session_negotiate->id[sVar34];
    }
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x2dc,"client hello, session id len.: %d",sVar23);
    mbedtls_debug_print_buf
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x2dd,"client hello, session id",puVar41 + 0x27,sVar23);
    if ((ssl->conf->field_0x164 & 2) == 0) {
      puVar25 = puVar41 + sVar34 + 0x27;
    }
    else {
      puVar25 = ssl->handshake->verify_cookie;
      if (puVar25 == (uchar *)0x0) {
        mbedtls_debug_print_msg
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0x2e7,"no verify cookie to send");
        puVar25 = puVar41 + sVar34 + 0x28;
        puVar41[sVar34 + 0x27] = '\0';
      }
      else {
        mbedtls_debug_print_buf
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0x2ee,"client hello, cookie",puVar25,(ulong)ssl->handshake->verify_cookie_len);
        puVar41[sVar34 + 0x27] = ssl->handshake->verify_cookie_len;
        memcpy(puVar41 + sVar34 + 0x28,ssl->handshake->verify_cookie,
               (ulong)ssl->handshake->verify_cookie_len);
        puVar25 = puVar41 + ssl->handshake->verify_cookie_len + sVar34 + 0x28;
      }
    }
    puVar42 = puVar25 + 2;
    uVar49 = 0;
    for (puVar39 = (uint *)ssl->conf->ciphersuite_list[ssl->minor_ver]; *puVar39 != 0;
        puVar39 = puVar39 + 1) {
      pmVar27 = mbedtls_ssl_ciphersuite_from_id(*puVar39);
      if ((((pmVar27 != (mbedtls_ssl_ciphersuite_t *)0x0) &&
           (pmVar4 = ssl->conf, pmVar27->min_minor_ver <= (int)(uint)pmVar4->max_minor_ver)) &&
          ((int)(uint)pmVar4->min_minor_ver <= pmVar27->max_minor_ver)) &&
         ((((*(uint *)&pmVar4->field_0x164 & 2) == 0 || ((pmVar27->flags & 4) == 0)) &&
          (((*(uint *)&pmVar4->field_0x164 & 0x40) == 0 ||
           (pmVar27->cipher != MBEDTLS_CIPHER_ARC4_128)))))) {
        mbedtls_debug_print_msg
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0x31a,"client hello, add ciphersuite: %2d",(ulong)*puVar39);
        uVar49 = uVar49 + 1;
        *puVar42 = *(uchar *)((long)puVar39 + 1);
        puVar42[1] = (uchar)*puVar39;
        puVar42 = puVar42 + 2;
      }
    }
    if (ssl->renego_status == 0) {
      puVar42[0] = '\0';
      puVar42[1] = 0xff;
      puVar42 = puVar42 + 2;
      uVar49 = uVar49 + 1;
    }
    if ((ssl->conf->field_0x166 & 2) != 0) {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x331,"adding FALLBACK_SCSV");
      puVar42[0] = 'V';
      puVar42[1] = '\0';
      puVar42 = puVar42 + 2;
      uVar49 = uVar49 + 1;
    }
    *puVar25 = (uchar)(uVar49 >> 7);
    puVar25[1] = (char)uVar49 * '\x02';
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x33b,"client hello, got %d ciphersuites",uVar49);
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x35a,"client hello, compress len.: %d",1);
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x35c,"client hello, compress alg.: %d",0);
    puVar42[0] = '\x01';
    puVar42[1] = '\0';
    puVar25 = puVar42 + 4;
    if (ssl->hostname == (char *)0x0) {
      uVar49 = 0;
    }
    else {
      puVar5 = ssl->out_msg;
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x48,"client hello, adding server name extension: %s");
      sVar30 = strlen(ssl->hostname);
      if ((puVar5 + 0x4000 < puVar25) ||
         (uVar49 = sVar30 + 9, (ulong)((long)(puVar5 + 0x4000) - (long)puVar25) < uVar49)) {
        uVar49 = 0;
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0x4e,"buffer too small");
      }
      else {
        puVar42[4] = '\0';
        puVar42[5] = '\0';
        puVar42[6] = (uchar)(sVar30 + 5 >> 8);
        puVar42[7] = (uchar)(sVar30 + 5);
        puVar42[8] = (uchar)(sVar30 + 3 >> 8);
        puVar42[9] = (uchar)(sVar30 + 3);
        puVar42[10] = '\0';
        puVar42[0xb] = (uchar)(sVar30 >> 8);
        puVar42[0xc] = (uchar)sVar30;
        memcpy(puVar42 + 0xd,ssl->hostname,sVar30);
      }
    }
    if (ssl->renego_status == 1) {
      puVar46 = puVar25 + uVar49;
      puVar5 = ssl->out_msg;
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x84,"client hello, adding renegotiation extension");
      if ((puVar5 + 0x4000 < puVar46) ||
         ((ulong)((long)(puVar5 + 0x4000) - (long)puVar46) < ssl->verify_data_len + 5)) {
        lVar40 = 0;
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0x88,"buffer too small");
      }
      else {
        puVar46[0] = 0xff;
        puVar46[1] = '\x01';
        puVar46[2] = '\0';
        puVar46[3] = (char)ssl->verify_data_len + '\x01';
        puVar46[4] = (uchar)ssl->verify_data_len;
        memcpy(puVar46 + 5,ssl->own_verify_data,ssl->verify_data_len);
        lVar40 = ssl->verify_data_len + 5;
      }
    }
    else {
      lVar40 = 0;
    }
    lVar40 = lVar40 + uVar49;
    local_150 = puVar42;
    if (ssl->conf->max_minor_ver == '\x03') {
      puVar5 = puVar25 + lVar40;
      puVar46 = ssl->out_msg;
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0xb2,"client hello, adding signature_algorithms extension");
      piVar6 = ssl->conf->sig_hashes;
      for (uVar49 = 6; *(int *)((long)piVar6 + (uVar49 - 6)) != 0; uVar49 = uVar49 + 4) {
      }
      if ((puVar46 + 0x4000 < puVar5) || ((ulong)((long)(puVar46 + 0x4000) - (long)puVar5) < uVar49)
         ) {
        lVar47 = 0;
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0xc0,"buffer too small");
      }
      else {
        for (lVar47 = 0; *(int *)((long)piVar6 + lVar47) != 0; lVar47 = lVar47 + 4) {
          uVar12 = mbedtls_ssl_hash_from_md_alg(*(int *)((long)piVar6 + lVar47));
          puVar42[lVar47 + lVar40 + 10] = uVar12;
          puVar42[lVar47 + lVar40 + 0xb] = '\x03';
          uVar12 = mbedtls_ssl_hash_from_md_alg(*(int *)((long)piVar6 + lVar47));
          puVar42[lVar47 + lVar40 + 0xc] = uVar12;
          puVar42[lVar47 + lVar40 + 0xd] = '\x01';
        }
        puVar5[0] = '\0';
        puVar5[1] = '\r';
        uVar12 = (uchar)((ulong)lVar47 >> 8);
        puVar5[2] = uVar12;
        puVar5[3] = (uchar)lVar47 + '\x02';
        puVar5[4] = uVar12;
        puVar5[5] = (uchar)lVar47;
        lVar47 = lVar47 + 6;
        puVar42 = local_150;
      }
    }
    else {
      lVar47 = 0;
    }
    local_158 = puVar42 + 2;
    puVar42 = ssl->out_msg;
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x106,"client hello, adding supported_elliptic_curves extension");
    pmVar7 = ssl->conf->curve_list;
    uVar49 = 6;
    while (puVar5 = local_150, mVar2 = *(mbedtls_ecp_group_id *)((long)pmVar7 + uVar49 * 2 + -0xc),
          mVar2 != MBEDTLS_ECP_DP_NONE) {
      mbedtls_ecp_curve_info_from_grp_id(mVar2);
      uVar49 = uVar49 + 2;
    }
    lVar47 = lVar47 + lVar40;
    puVar46 = puVar25 + lVar47;
    if ((puVar42 + 0x4000 < puVar46) || ((ulong)((long)(puVar42 + 0x4000) - (long)puVar46) < uVar49)
       ) {
      lVar40 = 0;
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x115,"buffer too small");
    }
    else {
      pmVar7 = ssl->conf->curve_list;
      lVar40 = 6;
      while (mVar2 = *(mbedtls_ecp_group_id *)((long)pmVar7 + lVar40 * 2 + -0xc),
            mVar2 != MBEDTLS_ECP_DP_NONE) {
        pmVar24 = mbedtls_ecp_curve_info_from_grp_id(mVar2);
        puVar5[lVar40 + lVar47 + 4] = *(uchar *)((long)&pmVar24->tls_id + 1);
        puVar5[lVar40 + lVar47 + 5] = (uchar)pmVar24->tls_id;
        lVar40 = lVar40 + 2;
      }
      if (lVar40 == 6) {
        lVar40 = 0;
      }
      else {
        puVar46[0] = '\0';
        puVar46[1] = '\n';
        puVar46[2] = (uchar)((ulong)(lVar40 + -4) >> 8);
        puVar46[3] = (uchar)(lVar40 + -4);
        puVar46[4] = (uchar)((ulong)(lVar40 + -6) >> 8);
        puVar46[5] = (char)lVar40 + 0xfa;
      }
    }
    puVar42 = puVar25 + lVar40 + lVar47;
    puVar5 = ssl->out_msg;
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x140,"client hello, adding supported_point_formats extension");
    if ((ulong)((long)(puVar5 + 0x4000) - (long)puVar42) < 6 || puVar5 + 0x4000 < puVar42) {
      lVar48 = 0;
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x144,"buffer too small");
    }
    else {
      puVar42[0] = '\0';
      puVar42[1] = '\v';
      puVar42[2] = '\0';
      puVar42[3] = '\x02';
      puVar42[4] = '\x01';
      puVar42[5] = '\0';
      lVar48 = 6;
    }
    lVar48 = lVar48 + lVar40 + lVar47;
    if ((*(ushort *)&ssl->conf->field_0x164 & 0x380) == 0) {
      lVar40 = 0;
    }
    else {
      puVar42 = puVar25 + lVar48;
      puVar5 = ssl->out_msg;
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x163,"client hello, adding max_fragment_length extension");
      if ((ulong)((long)(puVar5 + 0x4000) - (long)puVar42) < 5 || puVar5 + 0x4000 < puVar42) {
        lVar40 = 0;
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0x167,"buffer too small");
      }
      else {
        puVar42[0] = '\0';
        puVar42[1] = '\x01';
        puVar42[2] = '\0';
        puVar42[3] = '\x01';
        puVar42[4] = (byte)(*(uint *)&ssl->conf->field_0x164 >> 7) & 7;
        lVar40 = 5;
      }
    }
    lVar40 = lVar40 + lVar48;
    if ((ssl->conf->field_0x165 & 0x80) == 0) {
      lVar47 = 0;
    }
    else {
      puVar42 = puVar25 + lVar40;
      puVar5 = ssl->out_msg;
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x185,"client hello, adding truncated_hmac extension");
      if ((ulong)((long)(puVar5 + 0x4000) - (long)puVar42) < 4 || puVar5 + 0x4000 < puVar42) {
        lVar47 = 0;
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0x189,"buffer too small");
      }
      else {
        puVar42[0] = '\0';
        puVar42[1] = '\x04';
        puVar42[2] = '\0';
        puVar42[3] = '\0';
        lVar47 = 4;
      }
    }
    lVar47 = lVar47 + lVar40;
    if (((ssl->conf->field_0x165 & 4) == 0) || (ssl->conf->max_minor_ver == '\0')) {
      lVar40 = 0;
    }
    else {
      puVar42 = puVar25 + lVar47;
      puVar5 = ssl->out_msg;
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x1a7,"client hello, adding encrypt_then_mac extension");
      if ((ulong)((long)(puVar5 + 0x4000) - (long)puVar42) < 4 || puVar5 + 0x4000 < puVar42) {
        lVar40 = 0;
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0x1ab,"buffer too small");
      }
      else {
        puVar42[0] = '\0';
        puVar42[1] = '\x16';
        puVar42[2] = '\0';
        puVar42[3] = '\0';
        lVar40 = 4;
      }
    }
    lVar40 = lVar40 + lVar47;
    if (((ssl->conf->field_0x165 & 8) == 0) || (ssl->conf->max_minor_ver == '\0')) {
      uStackY_1b0 = 0;
    }
    else {
      puVar42 = puVar25 + lVar40;
      puVar5 = ssl->out_msg;
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x1c9,"client hello, adding extended_master_secret extension");
      if ((ulong)((long)(puVar5 + 0x4000) - (long)puVar42) < 4 || puVar5 + 0x4000 < puVar42) {
        uStackY_1b0 = 0;
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0x1cd,"buffer too small");
      }
      else {
        puVar42[0] = '\0';
        puVar42[1] = '\x17';
        puVar42[2] = '\0';
        puVar42[3] = '\0';
        uStackY_1b0 = 4;
      }
    }
    lVar40 = uStackY_1b0 + lVar40;
    if (ssl->conf->alpn_list == (char **)0x0) {
      lVar47 = 0;
    }
    else {
      local_160 = puVar25 + lVar40;
      puVar42 = ssl->out_msg;
      lVar47 = 0;
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x217,"client hello, adding alpn extension");
      for (ppcVar43 = ssl->conf->alpn_list; *ppcVar43 != (char *)0x0; ppcVar43 = ppcVar43 + 1) {
        sVar30 = strlen(*ppcVar43);
        lVar47 = lVar47 + (sVar30 & 0xff) + 1;
      }
      if ((puVar42 + 0x4000 < local_160) ||
         ((ulong)((long)(puVar42 + 0x4000) - (long)local_160) < lVar47 + 6U)) {
        lVar47 = 0;
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0x21e,"buffer too small");
      }
      else {
        local_160[0] = '\0';
        local_160[1] = '\x10';
        puVar42 = local_160 + 6;
        for (ppcVar43 = ssl->conf->alpn_list; *ppcVar43 != (char *)0x0; ppcVar43 = ppcVar43 + 1) {
          sVar30 = strlen(*ppcVar43);
          *puVar42 = (uchar)sVar30;
          memcpy(puVar42 + 1,*ppcVar43,sVar30 & 0xff);
          puVar42 = puVar42 + (sVar30 & 0xff) + 1;
        }
        lVar47 = (long)puVar42 - (long)local_160;
        local_160[4] = (uchar)((uint)((int)lVar47 + 0xfffa) >> 8);
        local_160[5] = (char)lVar47 + 0xfa;
        local_160[2] = (uchar)((uint)((int)lVar47 + 0xfffc) >> 8);
        local_160[3] = (char)lVar47 + 0xfc;
      }
    }
    lVar47 = lVar47 + lVar40;
    if ((ssl->conf->field_0x166 & 1) == 0) {
      uStackY_1b0 = 0;
    }
    else {
      puVar42 = puVar25 + lVar47;
      puVar5 = ssl->out_msg;
      sVar30 = ssl->session_negotiate->ticket_len;
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x1ea,"client hello, adding session ticket extension");
      if ((puVar5 + 0x4000 < puVar42) ||
         (uStackY_1b0 = sVar30 + 4, (ulong)((long)(puVar5 + 0x4000) - (long)puVar42) < uStackY_1b0))
      {
        uStackY_1b0 = 0;
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0x1ee,"buffer too small");
      }
      else {
        puVar42[0] = '\0';
        puVar42[1] = '#';
        puVar42[2] = (uchar)(sVar30 >> 8);
        puVar42[3] = (uchar)sVar30;
        if (sVar30 == 0 || ssl->session_negotiate->ticket == (uchar *)0x0) {
          uStackY_1b0 = 4;
        }
        else {
          mbedtls_debug_print_msg
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                     ,0x1ff,"sending session ticket of length %d",sVar30);
          memcpy(puVar42 + 4,ssl->session_negotiate->ticket,sVar30);
        }
      }
    }
    puVar42 = local_158;
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x39e,"client hello, total extension length: %d",uStackY_1b0 + lVar47);
    lVar47 = uStackY_1b0 + lVar47;
    if (lVar47 != 0) {
      *(ushort *)(local_150 + 2) = (ushort)lVar47 << 8 | (ushort)lVar47 >> 8;
      puVar42 = puVar25 + lVar47;
    }
    ssl->out_msglen = (long)puVar42 - (long)puVar41;
    ssl->out_msgtype = 0x16;
    *ssl->out_msg = '\x01';
    ssl->state = ssl->state + 1;
    if ((ssl->conf->field_0x164 & 2) != 0) {
      mbedtls_ssl_send_flight_completed(ssl);
    }
    iVar17 = mbedtls_ssl_write_record(ssl);
    if (iVar17 == 0) {
      pcVar37 = "<= write client hello";
      iVar17 = 0;
      iVar16 = 2;
      iVar18 = 0x3b8;
      goto LAB_00179155;
    }
    pcVar37 = "mbedtls_ssl_write_record";
    iVar16 = 0x3b4;
    goto LAB_0017912d;
  case 2:
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x4f3,"=> parse server hello");
    puVar41 = ssl->in_msg;
    iVar17 = mbedtls_ssl_read_record(ssl);
    if (iVar17 != 0) {
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x4f9,"mbedtls_ssl_read_record",iVar17);
      return iVar17;
    }
    if (ssl->in_msgtype != 0x16) {
      if (ssl->renego_status == 1) {
        iVar17 = ssl->renego_records_seen;
        ssl->renego_records_seen = iVar17 + 1;
        iVar16 = ssl->conf->renego_max_records;
        if (iVar17 < iVar16 || iVar16 < 0) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                     ,0x50c,"non-handshake message during renego");
          return -0x6b00;
        }
        pcVar37 = "renegotiation requested, but not honored by server";
        iVar17 = 1;
        iVar16 = 0x508;
      }
      else {
        pcVar37 = "bad server hello message";
        iVar17 = 1;
        iVar16 = 0x511;
      }
      goto LAB_00178734;
    }
    if ((ssl->conf->field_0x164 & 2) == 0) {
      lVar40 = 4;
    }
    else {
      if (*puVar41 == '\x03') {
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0x51a,"received hello verify request");
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0x51b,"<= parse server hello");
        puVar41 = ssl->in_msg;
        uVar20 = *(uint *)&ssl->conf->field_0x164 & 2;
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0x4a8,"=> parse hello verify request");
        mbedtls_debug_print_buf
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0x4b0,"server version",puVar41 + (ulong)uVar20 * 4 + 4,2);
        mbedtls_ssl_read_version
                  ((int *)&mbedtls_sha1,(int *)&mbedtls_md5,
                   *(uint *)&ssl->conf->field_0x164 >> 1 & 1,puVar41 + (ulong)uVar20 * 4 + 4);
        if (((1 < (int)mbedtls_md5.total[0] && 2 < (int)mbedtls_sha1.total[0]) &&
            (mbedtls_sha1.total[0] <= ssl->conf->max_major_ver)) &&
           (mbedtls_md5.total[0] <= ssl->conf->max_minor_ver)) {
          bVar13 = puVar41[(ulong)uVar20 * 4 + 6];
          uVar49 = (ulong)bVar13;
          mbedtls_debug_print_buf
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                     ,0x4c6,"cookie",puVar41 + (ulong)uVar20 * 4 + 7,uVar49);
          free(ssl->handshake->verify_cookie);
          puVar25 = (uchar *)calloc(1,uVar49);
          pmVar44 = ssl->handshake;
          pmVar44->verify_cookie = puVar25;
          if (puVar25 == (uchar *)0x0) {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                       ,0x4cd,"alloc failed (%d bytes)",uVar49);
            return -0x7f00;
          }
          memcpy(puVar25,puVar41 + (ulong)uVar20 * 4 + 7,uVar49);
          pmVar44->verify_cookie_len = bVar13;
          ssl->state = 1;
          mbedtls_ssl_reset_checksum(ssl);
          mbedtls_ssl_recv_flight_completed(ssl);
          pcVar37 = "<= parse hello verify request";
          iVar17 = 0;
          iVar16 = 2;
          iVar18 = 0x4da;
          goto LAB_00179155;
        }
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0x4bd,"bad server version");
        goto LAB_0017934a;
      }
      free(ssl->handshake->verify_cookie);
      pmVar44 = ssl->handshake;
      pmVar44->verify_cookie = (uchar *)0x0;
      pmVar44->verify_cookie_len = '\0';
      lVar40 = (ulong)((ssl->conf->field_0x164 & 2) >> 1) * 8 + 4;
    }
    if ((ssl->in_hslen < lVar40 + 0x26U) || (*puVar41 != '\x02')) {
      pcVar37 = "bad server hello message";
      iVar17 = 0x52b;
      goto LAB_0017833d;
    }
    puVar41 = puVar41 + lVar40;
    uVar52 = 0;
    mbedtls_debug_print_buf
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x53c,"server hello, version",puVar41,2);
    piVar6 = &ssl->minor_ver;
    mbedtls_ssl_read_version
              (&ssl->major_ver,piVar6,*(uint *)&ssl->conf->field_0x164 >> 1 & 1,puVar41);
    uVar20 = ssl->major_ver;
    pmVar4 = ssl->conf;
    if ((int)uVar20 < (int)(uint)pmVar4->min_major_ver) {
      uVar33 = (uint)pmVar4->min_minor_ver;
      uVar36 = *piVar6;
    }
    else {
      uVar36 = *piVar6;
      uVar33 = (uint)pmVar4->min_minor_ver;
      if ((((int)(uint)pmVar4->min_minor_ver <= (int)uVar36) && (uVar20 <= pmVar4->max_major_ver))
         && (uVar36 <= pmVar4->max_minor_ver)) {
        uVar20 = *(uint *)(puVar41 + 2);
        mbedtls_debug_print_msg
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0x556,"server hello, current time: %lu",
                   (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                          uVar20 << 0x18));
        pmVar44 = ssl->handshake;
        uVar51 = *(undefined8 *)(puVar41 + 2);
        uVar9 = *(undefined8 *)(puVar41 + 10);
        uVar10 = *(undefined8 *)(puVar41 + 0x1a);
        *(undefined8 *)(pmVar44->randbytes + 0x30) = *(undefined8 *)(puVar41 + 0x12);
        *(undefined8 *)(pmVar44->randbytes + 0x38) = uVar10;
        *(undefined8 *)(pmVar44->randbytes + 0x20) = uVar51;
        *(undefined8 *)(pmVar44->randbytes + 0x28) = uVar9;
        bVar13 = puVar41[0x22];
        uVar49 = (ulong)bVar13;
        mbedtls_debug_print_buf
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0x55d,"server hello, random bytes",puVar41 + 2,0x20);
        if (uVar49 < 0x21) {
          puVar25 = (uchar *)ssl->in_hslen;
          uVar38 = (ulong)((ssl->conf->field_0x164 & 2) >> 1);
          lVar40 = uVar38 * 8 + 4;
          if ((uchar *)(uVar38 * 8 + 0x2b + uVar49) < puVar25) {
            local_178 = (uchar *)(ulong)(ushort)(*(ushort *)(puVar41 + uVar49 + 0x26) << 8 |
                                                *(ushort *)(puVar41 + uVar49 + 0x26) >> 8);
            if ((local_178 + -1 < (uchar *)0x3) || (puVar25 != local_178 + lVar40 + uVar49 + 0x28))
            {
              pcVar37 = "bad server hello message";
              iVar17 = 0x56d;
              goto LAB_0017833d;
            }
          }
          else {
            if (puVar25 != (uchar *)(lVar40 + uVar49 + 0x26)) {
              pcVar37 = "bad server hello message";
              iVar17 = 0x577;
              goto LAB_0017833d;
            }
            local_178 = (uchar *)0x0;
          }
          if (puVar41[uVar49 + 0x25] != '\0') {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                       ,0x592,"server hello, bad compression: %d");
            return -0x7080;
          }
          uVar20 = (uint)(ushort)(*(ushort *)(puVar41 + uVar49 + 0x23) << 8 |
                                 *(ushort *)(puVar41 + uVar49 + 0x23) >> 8);
          pmVar27 = mbedtls_ssl_ciphersuite_from_id(uVar20);
          ssl->transform_negotiate->ciphersuite_info = pmVar27;
          if (pmVar27 == (mbedtls_ssl_ciphersuite_t *)0x0) {
            pcVar37 = "ciphersuite info for %04x not found";
            iVar17 = 0x59d;
            uVar49 = (ulong)uVar20;
            goto LAB_0017741a;
          }
          mbedtls_ssl_optimize_checksum(ssl,pmVar27);
          mbedtls_debug_print_msg
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                     ,0x5a3,"server hello, session id len.: %d",uVar49);
          puVar25 = puVar41 + 0x23;
          mbedtls_debug_print_buf
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                     ,0x5a4,"server hello, session id",puVar25,uVar49);
          pmVar44 = ssl->handshake;
          if (((((pmVar44->resume == 0) || (bVar13 == 0)) || (ssl->renego_status != 0)) ||
              ((pmVar8 = ssl->session_negotiate, pmVar8->ciphersuite != uVar20 ||
               (pmVar8->compression != 0)))) ||
             ((pmVar8->id_len != uVar49 || (iVar17 = bcmp(pmVar8->id,puVar25,uVar49), iVar17 != 0)))
             ) {
            ssl->state = ssl->state + 1;
            pmVar44->resume = 0;
            tVar28 = time((time_t *)0x0);
            pmVar8 = ssl->session_negotiate;
            pmVar8->start = tVar28;
            pmVar8->ciphersuite = uVar20;
            pmVar8->compression = 0;
            pmVar8->id_len = uVar49;
            memcpy(pmVar8->id,puVar25,uVar49);
          }
          else {
            ssl->state = 0xc;
            iVar17 = mbedtls_ssl_derive_keys(ssl);
            if (iVar17 != 0) {
              pcVar37 = "mbedtls_ssl_derive_keys";
              iVar16 = 0x5c2;
              goto LAB_0017912d;
            }
          }
          pcVar37 = "a";
          if (ssl->handshake->resume == 0) {
            pcVar37 = "no";
          }
          mbedtls_debug_print_msg
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                     ,0x5c8,"%s session has been resumed",pcVar37);
          mbedtls_debug_print_msg
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                     ,0x5ca,"server hello, chosen ciphersuite: %d",uVar20);
          mbedtls_debug_print_msg
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                     ,0x5cb,"server hello, compress alg.: %d",(ulong)puVar41[uVar49 + 0x25]);
          pmVar27 = mbedtls_ssl_ciphersuite_from_id(ssl->session_negotiate->ciphersuite);
          if ((pmVar27 == (mbedtls_ssl_ciphersuite_t *)0x0) ||
             (((ssl->conf->field_0x164 & 0x40) != 0 && (pmVar27->cipher == MBEDTLS_CIPHER_ARC4_128))
             )) {
            pcVar37 = "bad server hello message";
            iVar17 = 0x5d5;
          }
          else {
            piVar29 = ssl->conf->ciphersuite_list[*piVar6];
            do {
              iVar17 = *piVar29;
              if (iVar17 == 0) {
                pcVar37 = "bad server hello message";
                iVar17 = 0x5de;
                goto LAB_0017833d;
              }
              piVar29 = piVar29 + 1;
            } while (iVar17 != ssl->session_negotiate->ciphersuite);
            ssl->session_negotiate->compression = 0;
            local_170 = (ushort *)(puVar41 + uVar49 + 0x28);
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                       ,0x5f6,"server hello, total extension length: %d",local_178);
            local_140 = ssl->own_verify_data;
            local_148 = ssl->peer_verify_data;
            local_160 = (uchar *)((ulong)local_160 & 0xffffffff00000000);
            do {
              if (local_178 == (uchar *)0x0) {
                iVar17 = ssl->secure_renegotiation;
                if ((iVar17 == 0) && ((*(uint *)&ssl->conf->field_0x164 & 0x30) == 0x20)) {
                  pcVar37 = "legacy renegotiation, breaking off handshake";
                  iVar17 = 0x680;
                  goto LAB_0017a898;
                }
                if (ssl->renego_status == 1) {
                  if (iVar17 == 1 && (int)local_160 == 0) {
                    pcVar37 = "renegotiation_info extension missing (secure)";
                    iVar17 = 0x688;
                    goto LAB_0017a898;
                  }
                  if (iVar17 == 0) {
                    if ((ssl->conf->field_0x164 & 0x30) == 0) {
                      pcVar37 = "legacy renegotiation not allowed";
                      iVar17 = 0x68f;
                      goto LAB_0017a898;
                    }
                    if ((int)local_160 == 1) {
                      pcVar37 = "renegotiation_info extension present (legacy)";
                      iVar17 = 0x696;
                      goto LAB_0017a898;
                    }
                  }
                }
                pcVar37 = "<= parse server hello";
                iVar17 = 0;
                iVar16 = 2;
                iVar18 = 0x6a3;
                goto LAB_00179155;
              }
              uVar14 = local_170[1] << 8 | local_170[1] >> 8;
              local_150 = (uchar *)(ulong)(uVar14 + 4);
              bVar50 = local_178 < local_150;
              local_178 = local_178 + -(long)local_150;
              if (bVar50) {
                pcVar37 = "bad server hello message";
                iVar17 = 0x601;
                goto LAB_0017833d;
              }
              uVar15 = *local_170 << 8 | *local_170 >> 8;
              uVar49 = (ulong)uVar15;
              if (uVar15 == 1) {
                mbedtls_debug_print_msg
                          (ssl,3,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                           ,0x615,"found max_fragment_length extension");
                if (uVar14 != 1) {
                  return -0x7980;
                }
                uVar20 = *(uint *)&ssl->conf->field_0x164 >> 7 & 7;
                if (uVar20 == 0) {
                  return -0x7980;
                }
                if (uVar20 != (byte)local_170[2]) {
                  return -0x7980;
                }
              }
              else if (uVar15 == 4) {
                mbedtls_debug_print_msg
                          (ssl,3,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                           ,0x622,"found truncated_hmac extension");
                if (uVar14 != 0) {
                  return -0x7980;
                }
                if ((*(uint *)&ssl->conf->field_0x164 & 0x8000) == 0) {
                  return -0x7980;
                }
                ssl->session_negotiate->trunc_hmac = 1;
              }
              else if (uVar15 == 0xb) {
                mbedtls_debug_print_msg
                          (ssl,3,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                           ,0x656,"found supported_point_formats extension");
                if ((ushort)((byte)local_170[2] + 1) != uVar14) {
                  pcVar37 = "bad server hello message";
                  iVar17 = 0x456;
                  goto LAB_0017833d;
                }
                uVar49 = 0;
                do {
                  uVar38 = uVar49;
                  if ((byte)local_170[2] == uVar38) {
                    pcVar37 = "no point format in common";
                    iVar17 = 0x469;
                    goto LAB_0017833d;
                  }
                  uVar20 = (uint)*(byte *)((long)local_170 + uVar38 + 5);
                  uVar49 = uVar38 + 1;
                } while (1 < uVar20);
                (ssl->handshake->ecdh_ctx).point_format = uVar20;
                uVar49 = (ulong)*(byte *)((long)local_170 + uVar38 + 5);
                iVar17 = 4;
                iVar16 = 0x461;
                pcVar37 = "point format selected: %d";
LAB_0017a5e0:
                mbedtls_debug_print_msg
                          (ssl,iVar17,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                           ,iVar16,pcVar37,uVar49);
              }
              else {
                uVar20 = (uint)uVar14;
                iVar17 = 3;
                if (uVar15 == 0x10) {
                  mbedtls_debug_print_msg
                            (ssl,3,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                             ,0x663,"found alpn extension");
                  if (uVar20 < 4) {
                    return -0x7980;
                  }
                  ppcVar43 = ssl->conf->alpn_list;
                  if (ppcVar43 == (char **)0x0) {
                    return -0x7980;
                  }
                  uVar49 = (ulong)(ushort)(local_170[2] << 8 | local_170[2] >> 8);
                  if (uVar49 != (ulong)uVar20 - 2) {
                    return -0x7980;
                  }
                  uVar38 = (ulong)(byte)local_170[3];
                  if (uVar49 - 1 != uVar38) {
                    return -0x7980;
                  }
                  local_158 = (uchar *)((long)local_170 + 7);
                  while( true ) {
                    pcVar37 = *ppcVar43;
                    if (pcVar37 == (char *)0x0) {
                      return -0x7980;
                    }
                    sVar30 = strlen(pcVar37);
                    if ((sVar30 == uVar38) && (iVar17 = bcmp(local_158,pcVar37,uVar38), iVar17 == 0)
                       ) break;
                    ppcVar43 = ppcVar43 + 1;
                  }
                  ssl->alpn_chosen = pcVar37;
                }
                else if (uVar15 == 0x16) {
                  mbedtls_debug_print_msg
                            (ssl,3,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                             ,0x62f,"found encrypt_then_mac extension");
                  if ((ssl->conf->field_0x165 & 4) == 0) {
                    return -0x7980;
                  }
                  if (uVar14 != 0) {
                    return -0x7980;
                  }
                  if (*piVar6 == 0) {
                    return -0x7980;
                  }
                  ssl->session_negotiate->encrypt_then_mac = 1;
                }
                else if (uVar15 == 0x17) {
                  mbedtls_debug_print_msg
                            (ssl,3,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                             ,0x63c,"found extended_master_secret extension");
                  if ((ssl->conf->field_0x165 & 8) == 0) {
                    return -0x7980;
                  }
                  if (uVar14 != 0) {
                    return -0x7980;
                  }
                  if (*piVar6 == 0) {
                    return -0x7980;
                  }
                  ssl->handshake->extended_ms = 1;
                }
                else if (uVar15 == 0x23) {
                  mbedtls_debug_print_msg
                            (ssl,3,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                             ,0x649,"found session_ticket extension");
                  if (uVar14 != 0) {
                    return -0x7980;
                  }
                  if ((*(uint *)&ssl->conf->field_0x164 & 0x10000) == 0) {
                    return -0x7980;
                  }
                  ssl->handshake->new_session_ticket = 1;
                }
                else {
                  if (uVar15 != 0xff01) {
                    iVar16 = 0x66d;
                    pcVar37 = "unknown extension found: %d (ignoring)";
                    goto LAB_0017a5e0;
                  }
                  mbedtls_debug_print_msg
                            (ssl,3,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                             ,0x608,"found renegotiation extension");
                  if (ssl->renego_status != 0) {
                    sVar23 = ssl->verify_data_len;
                    if ((sVar23 * 2 + 1 == (ulong)uVar20) &&
                       (sVar23 * 2 == (ulong)(byte)local_170[2])) {
                      iVar17 = mbedtls_ssl_safer_memcmp
                                         ((void *)((long)local_170 + 5),local_140,sVar23);
                      if (iVar17 == 0) {
                        iVar17 = mbedtls_ssl_safer_memcmp
                                           ((void *)((long)local_170 + 5 + sVar23),local_148,sVar23)
                        ;
                        local_160 = (uchar *)CONCAT44(local_160._4_4_,1);
                        if (iVar17 == 0) goto LAB_0017a675;
                      }
                    }
                    pcVar37 = "non-matching renegotiation info";
                    iVar17 = 0x3ce;
LAB_0017a898:
                    mbedtls_debug_print_msg
                              (ssl,1,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                               ,iVar17,pcVar37);
                    iVar17 = mbedtls_ssl_send_fatal_handshake_failure(ssl);
                    if (iVar17 != 0) {
                      return iVar17;
                    }
                    return -0x7980;
                  }
                  if ((uVar14 != 1) || ((char)local_170[2] != '\0')) {
                    pcVar37 = "non-zero length renegotiation info";
                    iVar17 = 0x3db;
                    goto LAB_0017a898;
                  }
                  ssl->secure_renegotiation = 1;
                  local_160 = (uchar *)CONCAT44(local_160._4_4_,1);
                }
              }
LAB_0017a675:
              local_170 = (ushort *)((long)local_170 + (long)local_150);
            } while ((uchar *)0x2 < local_178 + -1);
            pcVar37 = "bad server hello message";
            iVar17 = 0x675;
          }
        }
        else {
          pcVar37 = "bad server hello message";
          iVar17 = 0x561;
        }
LAB_0017833d:
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,iVar17,pcVar37);
        return -0x7980;
      }
    }
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x549,"server version out of bounds -  min: [%d:%d], server: [%d:%d], max: [%d:%d]",
               (ulong)pmVar4->min_major_ver,CONCAT44(uVar52,uVar33),CONCAT44(uVar53,uVar20),uVar36,
               (uint)pmVar4->max_major_ver,(uint)pmVar4->max_minor_ver);
LAB_0017934a:
    mbedtls_ssl_send_alert_message(ssl,'\x02','F');
    return -0x6e80;
  case 3:
    iVar17 = mbedtls_ssl_parse_certificate(ssl);
    return iVar17;
  case 4:
    pmVar27 = ssl->transform_negotiate->ciphersuite_info;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x7ef,"=> parse server key exchange");
    if (pmVar27->key_exchange - MBEDTLS_KEY_EXCHANGE_ECDH_RSA < 2) {
      pmVar3 = ssl->session_negotiate->peer_cert;
      if (pmVar3 == (mbedtls_x509_crt *)0x0) {
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0x7ca,"certificate required");
        iVar17 = -0x7700;
      }
      else {
        iVar17 = mbedtls_pk_can_do(&pmVar3->pk,MBEDTLS_PK_ECKEY);
        if (iVar17 == 0) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                     ,0x7d1,"server key not ECDH capable");
          iVar17 = -0x6d00;
        }
        else {
          iVar17 = mbedtls_ecdh_get_params
                             (&ssl->handshake->ecdh_ctx,
                              (mbedtls_ecp_keypair *)(ssl->session_negotiate->peer_cert->pk).pk_ctx,
                              MBEDTLS_ECDH_THEIRS);
          if (iVar17 == 0) {
            iVar17 = ssl_check_server_ecdh_params(ssl);
            if (iVar17 == 0) {
              pcVar37 = "<= skip parse server key exchange";
              iVar17 = 0x807;
              goto LAB_00177c19;
            }
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                       ,0x7e0,"bad server certificate (ECDH curve)");
            iVar17 = -0x7a00;
          }
          else {
            mbedtls_debug_print_ret
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                       ,0x7da,"mbedtls_ecdh_get_params",iVar17);
          }
        }
      }
      pcVar37 = "ssl_get_ecdh_params_from_cert";
      iVar16 = 0x803;
      goto LAB_0017912d;
    }
    if (pmVar27->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA) {
      pcVar37 = "<= skip parse server key exchange";
      iVar17 = 0x7f4;
      goto LAB_00177c19;
    }
    iVar17 = mbedtls_ssl_read_record(ssl);
    if (iVar17 != 0) {
      pcVar37 = "mbedtls_ssl_read_record";
      iVar16 = 0x812;
      goto LAB_0017912d;
    }
    if (ssl->in_msgtype != 0x16) {
      pcVar37 = "bad server key exchange message";
      iVar17 = 1;
      iVar16 = 0x818;
      goto LAB_00178734;
    }
    puVar41 = ssl->in_msg;
    if (*puVar41 != '\f') {
      if ((pmVar27->key_exchange | MBEDTLS_KEY_EXCHANGE_DHE_RSA) != MBEDTLS_KEY_EXCHANGE_RSA_PSK) {
        pcVar37 = "bad server key exchange message";
        iVar17 = 1;
        iVar16 = 0x829;
        goto LAB_00178734;
      }
      ssl->record_read = 1;
LAB_0017926f:
      ssl->state = ssl->state + 1;
      pcVar37 = "<= parse server key exchange";
      iVar17 = 0;
      iVar16 = 2;
      iVar18 = 0x920;
      goto LAB_00179155;
    }
    uVar49 = (ulong)(*(uint *)&ssl->conf->field_0x164 & 2);
    puVar45 = (ushort *)(puVar41 + uVar49 * 4 + 4);
    end = (ushort *)(puVar41 + ssl->in_hslen);
    sVar23 = ssl->in_hslen - (uVar49 * 4 + 4);
    local_168 = puVar45;
    mbedtls_debug_print_buf
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x82f,"server key exchange",(uchar *)puVar45,sVar23);
    uVar52 = (undefined4)(sVar23 >> 0x20);
    mVar1 = pmVar27->key_exchange;
    puVar31 = local_168;
    if ((mVar1 - MBEDTLS_KEY_EXCHANGE_PSK < 4) &&
       (puVar31 = (ushort *)((long)puVar45 + (ulong)(ushort)(*puVar45 << 8 | *puVar45 >> 8) + 2),
       end < puVar31)) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x72a,"bad server key exchange message (psk_identity_hint length)");
      iVar17 = 0x839;
      goto LAB_00179d5d;
    }
    local_168 = puVar31;
    if (MBEDTLS_KEY_EXCHANGE_ECDHE_PSK < mVar1) {
LAB_00179930:
      iVar17 = 0x867;
LAB_00178029:
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,iVar17,"should never happen");
      return -0x6c00;
    }
    if ((0x118U >> (mVar1 & 0x1f) & 1) != 0) {
      iVar17 = mbedtls_ecdh_read_params(&ssl->handshake->ecdh_ctx,(uchar **)&local_168,(uchar *)end)
      ;
      if (iVar17 == 0) {
        iVar17 = ssl_check_server_ecdh_params(ssl);
        if (iVar17 == 0) goto LAB_00179688;
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0x70d,"bad server key exchange message (ECDHE curve)");
      }
      else {
        mbedtls_debug_print_ret
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0x707,"mbedtls_ecdh_read_params",iVar17);
      }
      iVar17 = 0x85e;
      goto LAB_00179d5d;
    }
    if ((0x44U >> (mVar1 & 0x1f) & 1) != 0) {
      iVar17 = mbedtls_dhm_read_params(&ssl->handshake->dhm_ctx,(uchar **)&local_168,(uchar *)end);
      if (iVar17 == 0) {
        uVar49 = (ssl->handshake->dhm_ctx).len << 3;
        uVar20 = ssl->conf->dhm_min_bitlen;
        if (uVar20 <= uVar49) {
          mbedtls_debug_print_mpi
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                     ,0x6c6,"DHM: P ",&(ssl->handshake->dhm_ctx).P);
          mbedtls_debug_print_mpi
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                     ,0x6c7,"DHM: G ",&(ssl->handshake->dhm_ctx).G);
          mbedtls_debug_print_mpi
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                     ,0x6c8,"DHM: GY",&(ssl->handshake->dhm_ctx).GY);
          goto LAB_00179688;
        }
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0x6c2,"DHM prime too short: %d < %d",uVar49,CONCAT44(uVar52,uVar20));
      }
      else {
        mbedtls_debug_print_ret
                  (ssl,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0x6ba,"mbedtls_dhm_read_params",iVar17);
      }
      iVar17 = 0x84e;
      goto LAB_00179d5d;
    }
    if ((0xa0U >> (mVar1 & 0x1f) & 1) == 0) goto LAB_00179930;
LAB_00179688:
    puVar31 = local_168;
    if (2 < pmVar27->key_exchange - MBEDTLS_KEY_EXCHANGE_DHE_RSA) goto LAB_0017926f;
    puVar41 = ssl->in_msg;
    bVar13 = ssl->conf->field_0x164;
    if (ssl->minor_ver != 3) {
      if (2 < ssl->minor_ver) {
        iVar17 = 0x89b;
        goto LAB_00178029;
      }
      type = mbedtls_ssl_get_ciphersuite_sig_pk_alg(pmVar27);
      mVar35 = (uint)(type == MBEDTLS_PK_ECDSA) << 2;
LAB_00179a9c:
      uVar49 = (ulong)(ushort)(*local_168 << 8 | *local_168 >> 8);
      puVar45 = local_168 + 1;
      if (end != (ushort *)((long)local_168 + uVar49 + 2)) {
        iVar17 = 0x8a7;
        local_168 = puVar45;
        goto LAB_00179d5d;
      }
      puVar41 = puVar41 + (ulong)((bVar13 & 2) >> 1) * 8 + 4;
      sVar23 = (long)puVar31 - (long)puVar41;
      local_168 = puVar45;
      mbedtls_debug_print_buf
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x8ab,"signature",(uchar *)puVar45,uVar49);
      if (mVar35 == MBEDTLS_MD_NONE) {
        mbedtls_md5_init(&mbedtls_md5);
        mbedtls_sha1_init(&mbedtls_sha1);
        mbedtls_md5_starts(&mbedtls_md5);
        mbedtls_md5_update(&mbedtls_md5,ssl->handshake->randbytes,0x40);
        mbedtls_md5_update(&mbedtls_md5,puVar41,sVar23);
        mbedtls_md5_finish(&mbedtls_md5,hash);
        mbedtls_sha1_starts(&mbedtls_sha1);
        mbedtls_sha1_update(&mbedtls_sha1,ssl->handshake->randbytes,0x40);
        mbedtls_sha1_update(&mbedtls_sha1,puVar41,sVar23);
        mbedtls_sha1_finish(&mbedtls_sha1,hash + 0x10);
        mbedtls_md5_free(&mbedtls_md5);
        mbedtls_sha1_free(&mbedtls_sha1);
        sVar23 = 0x24;
        sVar34 = sVar23;
      }
      else {
        mbedtls_md_init((mbedtls_md_context_t *)&mbedtls_sha1);
        pmVar26 = mbedtls_md_info_from_type(mVar35);
        iVar17 = mbedtls_md_setup((mbedtls_md_context_t *)&mbedtls_sha1,pmVar26,0);
        if (iVar17 != 0) {
          pcVar37 = "mbedtls_md_setup";
          iVar16 = 0x8ee;
          goto LAB_0017912d;
        }
        mbedtls_md_starts((mbedtls_md_context_t *)&mbedtls_sha1);
        mbedtls_md_update((mbedtls_md_context_t *)&mbedtls_sha1,ssl->handshake->randbytes,0x40);
        mbedtls_md_update((mbedtls_md_context_t *)&mbedtls_sha1,puVar41,sVar23);
        mbedtls_md_finish((mbedtls_md_context_t *)&mbedtls_sha1,hash);
        mbedtls_md_free((mbedtls_md_context_t *)&mbedtls_sha1);
        pmVar26 = mbedtls_md_info_from_type(mVar35);
        bVar13 = mbedtls_md_get_size(pmVar26);
        sVar23 = (size_t)bVar13;
        sVar34 = 0;
      }
      mbedtls_debug_print_buf
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x901,"parameters hash",hash,sVar23);
      pmVar3 = ssl->session_negotiate->peer_cert;
      if (pmVar3 == (mbedtls_x509_crt *)0x0) {
        pcVar37 = "certificate required";
        iVar17 = 2;
        iVar16 = 0x905;
        goto LAB_00178734;
      }
      iVar17 = mbedtls_pk_can_do(&pmVar3->pk,type);
      if (iVar17 == 0) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0x90e,"bad server key exchange message");
        return -0x6d00;
      }
      iVar17 = mbedtls_pk_verify(&ssl->session_negotiate->peer_cert->pk,mVar35,hash,sVar34,
                                 (uchar *)local_168,uVar49);
      if (iVar17 != 0) {
        pcVar37 = "mbedtls_pk_verify";
        iVar16 = 0x915;
        goto LAB_0017912d;
      }
      goto LAB_0017926f;
    }
    if (local_168 + 1 <= end) {
      mVar35 = mbedtls_ssl_md_alg_from_hash((byte)*local_168);
      if (mVar35 == MBEDTLS_MD_NONE) {
        bVar13 = (byte)*local_168;
        pcVar37 = "Server used unsupported HashAlgorithm %d";
        iVar17 = 0x7a0;
      }
      else {
        type = mbedtls_ssl_pk_alg_from_sig(*(byte *)((long)local_168 + 1));
        if (type != MBEDTLS_PK_NONE) {
          iVar17 = mbedtls_ssl_check_sig_hash(ssl,mVar35);
          if (iVar17 == 0) {
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                       ,0x7b8,"Server used SignatureAlgorithm %d",
                       (ulong)*(byte *)((long)local_168 + 1));
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                       ,0x7b9,"Server used HashAlgorithm %d",(ulong)(byte)*local_168);
            local_168 = local_168 + 1;
            mVar19 = mbedtls_ssl_get_ciphersuite_sig_pk_alg(pmVar27);
            if (type != mVar19) {
              iVar17 = 0x888;
              goto LAB_00179d5d;
            }
            goto LAB_00179a9c;
          }
          mbedtls_debug_print_msg
                    (ssl,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                     ,0x7b4,"server used HashAlgorithm that was not offered");
          goto LAB_00179d44;
        }
        bVar13 = *(byte *)((long)local_168 + 1);
        pcVar37 = "server used unsupported SignatureAlgorithm %d";
        iVar17 = 0x7aa;
      }
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,iVar17,pcVar37,(ulong)bVar13);
    }
LAB_00179d44:
    iVar17 = 0x882;
LAB_00179d5d:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,iVar17,"bad server key exchange message");
    return -0x7b00;
  case 5:
    pmVar27 = ssl->transform_negotiate->ciphersuite_info;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x945,"=> parse certificate request");
    if (pmVar27->key_exchange - MBEDTLS_KEY_EXCHANGE_PSK < 4) {
      pcVar37 = "<= skip parse certificate request";
      iVar17 = 0x94c;
      goto LAB_00177c19;
    }
    if (ssl->record_read == 0) {
      iVar17 = mbedtls_ssl_read_record(ssl);
      if (iVar17 != 0) {
        pcVar37 = "mbedtls_ssl_read_record";
        iVar16 = 0x955;
        goto LAB_0017912d;
      }
      if (ssl->in_msgtype != 0x16) {
        pcVar37 = "bad certificate request message";
        iVar17 = 1;
        iVar16 = 0x95b;
        goto LAB_00178734;
      }
      ssl->record_read = 1;
    }
    ssl->client_auth = 0;
    ssl->state = ssl->state + 1;
    if (*ssl->in_msg == '\r') {
      ssl->client_auth = 1;
      pcVar37 = "a";
    }
    else {
      pcVar37 = "no";
    }
    iVar17 = 0;
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x969,"got %s certificate request",pcVar37);
    if (ssl->client_auth != 0) {
      ssl->record_read = 0;
      puVar41 = ssl->in_msg;
      uVar49 = (ulong)((ssl->conf->field_0x164 & 2) >> 1);
      uVar38 = (ulong)puVar41[uVar49 * 8 + 4];
      if (ssl->in_hslen < uVar38 + uVar49 * 8 + 6) {
        iVar17 = 0x984;
LAB_001789a8:
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,iVar17,"bad certificate request message");
        return -0x7a80;
      }
      iVar16 = 1;
      lVar40 = uVar49 * 8 + 5;
      for (uVar49 = 0; uVar38 != uVar49; uVar49 = uVar49 + 1) {
        uVar12 = puVar41[uVar49 + lVar40];
        if (uVar12 == '\x01') {
          pmVar22 = mbedtls_ssl_own_key(ssl);
          iVar18 = mbedtls_pk_can_do(pmVar22,MBEDTLS_PK_RSA);
          if (iVar18 == 0) {
            uVar12 = puVar41[uVar49 + lVar40];
            goto LAB_00177c9f;
          }
LAB_001788bb:
          ssl->handshake->cert_type = iVar16;
          break;
        }
LAB_00177c9f:
        if (uVar12 == '@') {
          pmVar22 = mbedtls_ssl_own_key(ssl);
          iVar18 = mbedtls_pk_can_do(pmVar22,MBEDTLS_PK_ECDSA);
          if (iVar18 != 0) {
            iVar16 = 0x40;
            goto LAB_001788bb;
          }
        }
      }
      uVar20 = *(uint *)&ssl->conf->field_0x164;
      if (ssl->minor_ver == 3) {
        uVar32 = (ulong)(uVar20 & 2);
        uVar38 = uVar38 + (ushort)(*(ushort *)(puVar41 + uVar38 + uVar32 * 4 + 5) << 8 |
                                  *(ushort *)(puVar41 + uVar38 + uVar32 * 4 + 5) >> 8);
        uVar49 = ssl->in_hslen;
        if (uVar49 < uVar38 + uVar32 * 4 + 6) {
          iVar17 = 0x9b2;
          goto LAB_001789a8;
        }
        lVar40 = 2;
      }
      else {
        uVar49 = ssl->in_hslen;
        lVar40 = 0;
      }
      uVar32 = (ulong)((uVar20 & 2) != 0);
      if (uVar49 != (ulong)(ushort)(*(ushort *)(puVar41 + uVar38 + lVar40 + uVar32 * 8 + 5) << 8 |
                                   *(ushort *)(puVar41 + uVar38 + lVar40 + uVar32 * 8 + 5) >> 8) +
                    uVar38 + uVar32 * 8 + lVar40 + 7) {
        iVar17 = 0x9c0;
        goto LAB_001789a8;
      }
    }
    pcVar37 = "<= parse certificate request";
    iVar16 = 2;
    iVar18 = 0x9c5;
    goto LAB_00179155;
  case 6:
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x9d2,"=> parse server hello done");
    if (ssl->record_read == 0) {
      iVar17 = mbedtls_ssl_read_record(ssl);
      if (iVar17 != 0) {
        pcVar37 = "mbedtls_ssl_read_record";
        iVar16 = 0x9d8;
        goto LAB_0017912d;
      }
      if (ssl->in_msgtype != 0x16) {
        pcVar37 = "bad server hello done message";
        iVar17 = 1;
        iVar16 = 0x9de;
        goto LAB_00178734;
      }
    }
    ssl->record_read = 0;
    if ((ssl->in_hslen != (ulong)((ssl->conf->field_0x164 & 2) >> 1) * 8 + 4) ||
       (*ssl->in_msg != '\x0e')) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x9e7,"bad server hello done message");
      return -0x7b80;
    }
    ssl->state = ssl->state + 1;
    if ((ssl->conf->field_0x164 & 2) != 0) {
      mbedtls_ssl_recv_flight_completed(ssl);
    }
    pcVar37 = "<= parse server hello done";
    iVar17 = 0;
    iVar16 = 2;
    iVar18 = 0x9f2;
    goto LAB_00179155;
  case 7:
    iVar17 = mbedtls_ssl_write_certificate(ssl);
    return iVar17;
  case 8:
    pmVar27 = ssl->transform_negotiate->ciphersuite_info;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x9fd,"=> write client key exchange");
    switch(pmVar27->key_exchange) {
    case MBEDTLS_KEY_EXCHANGE_RSA:
      uStackY_1b0 = 4;
      iVar17 = ssl_write_encrypted_pms(ssl,4,(size_t *)&mbedtls_sha1,0);
      if (iVar17 != 0) {
        return iVar17;
      }
      break;
    case MBEDTLS_KEY_EXCHANGE_DHE_RSA:
      mbedtls_sha1.total = (uint32_t  [2])(ssl->handshake->dhm_ctx).len;
      ssl->out_msg[4] = mbedtls_sha1.total[0]._1_1_;
      ssl->out_msg[5] = (uchar)mbedtls_sha1.total[0];
      pmVar44 = ssl->handshake;
      sVar23 = mbedtls_mpi_size(&(pmVar44->dhm_ctx).P);
      iVar17 = mbedtls_dhm_make_public
                         (&pmVar44->dhm_ctx,(int)sVar23,ssl->out_msg + 6,(size_t)mbedtls_sha1.total,
                          ssl->conf->f_rng,ssl->conf->p_rng);
      if (iVar17 != 0) {
        pcVar37 = "mbedtls_dhm_make_public";
        iVar16 = 0xa11;
        goto LAB_0017912d;
      }
      mbedtls_debug_print_mpi
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0xa15,"DHM: X ",&(ssl->handshake->dhm_ctx).X);
      mbedtls_debug_print_mpi
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0xa16,"DHM: GX",&(ssl->handshake->dhm_ctx).GX);
      pmVar44 = ssl->handshake;
      iVar17 = mbedtls_dhm_calc_secret
                         (&pmVar44->dhm_ctx,pmVar44->premaster,0x424,&pmVar44->pmslen,
                          ssl->conf->f_rng,ssl->conf->p_rng);
      if (iVar17 != 0) {
        pcVar37 = "mbedtls_dhm_calc_secret";
        iVar16 = 0xa1e;
        goto LAB_0017912d;
      }
      uStackY_1b0 = 6;
      X = &(ssl->handshake->dhm_ctx).K;
      pcVar37 = "DHM: K ";
      iVar17 = 0xa22;
      goto LAB_001781ce;
    case MBEDTLS_KEY_EXCHANGE_ECDHE_RSA:
    case MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA:
    case MBEDTLS_KEY_EXCHANGE_ECDH_RSA:
    case MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA:
      iVar17 = mbedtls_ecdh_make_public
                         (&ssl->handshake->ecdh_ctx,(size_t *)&mbedtls_sha1,ssl->out_msg + 4,1000,
                          ssl->conf->f_rng,ssl->conf->p_rng);
      if (iVar17 != 0) {
        pcVar37 = "mbedtls_ecdh_make_public";
        iVar16 = 0xa3a;
        goto LAB_0017912d;
      }
      mbedtls_debug_print_ecp
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0xa3e,"ECDH: Q",&(ssl->handshake->ecdh_ctx).Q);
      pmVar44 = ssl->handshake;
      iVar17 = mbedtls_ecdh_calc_secret
                         (&pmVar44->ecdh_ctx,&pmVar44->pmslen,pmVar44->premaster,0x400,
                          ssl->conf->f_rng,ssl->conf->p_rng);
      if (iVar17 != 0) {
        pcVar37 = "mbedtls_ecdh_calc_secret";
        iVar16 = 0xa46;
        goto LAB_0017912d;
      }
      uStackY_1b0 = 4;
      X = &(ssl->handshake->ecdh_ctx).z;
      pcVar37 = "ECDH: z";
      iVar17 = 0xa4a;
LAB_001781ce:
      mbedtls_debug_print_mpi
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,iVar17,pcVar37,X);
      break;
    case MBEDTLS_KEY_EXCHANGE_PSK:
    case MBEDTLS_KEY_EXCHANGE_DHE_PSK:
    case MBEDTLS_KEY_EXCHANGE_RSA_PSK:
    case MBEDTLS_KEY_EXCHANGE_ECDHE_PSK:
      pmVar4 = ssl->conf;
      if ((pmVar4->psk == (uchar *)0x0) || (pmVar4->psk_identity == (uchar *)0x0)) {
        pcVar37 = "got no private key for PSK";
        iVar17 = 0xa5c;
LAB_0017794e:
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,iVar17,pcVar37);
        return -0x7600;
      }
      mbedtls_sha1.total = (uint32_t  [2])pmVar4->psk_identity_len;
      if ((long)mbedtls_sha1.total - 0x3ffbU < 0xffffffffffffbfff) {
        pcVar37 = "psk identity too long or SSL buffer too short";
        iVar17 = 0xa66;
LAB_001778b8:
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,iVar17,pcVar37);
        return -0x6a00;
      }
      ssl->out_msg[4] = mbedtls_sha1.total[0]._1_1_;
      ssl->out_msg[5] = (uchar)mbedtls_sha1.total[0];
      memcpy(ssl->out_msg + 6,ssl->conf->psk_identity,ssl->conf->psk_identity_len);
      if (3 < pmVar27->key_exchange - MBEDTLS_KEY_EXCHANGE_PSK) {
        iVar17 = 0xab1;
        goto LAB_00178029;
      }
      pmVar4 = ssl->conf;
      sVar23 = pmVar4->psk_identity_len;
      uStackY_1b0 = sVar23 + 6;
      switch(pmVar27->key_exchange) {
      case MBEDTLS_KEY_EXCHANGE_PSK:
        mbedtls_sha1.total[0] = 0;
        mbedtls_sha1.total[1] = 0;
        break;
      case MBEDTLS_KEY_EXCHANGE_DHE_PSK:
        mbedtls_sha1.total = (uint32_t  [2])(ssl->handshake->dhm_ctx).len;
        if (0x4000 < (long)mbedtls_sha1.total + sVar23 + 8) {
          pcVar37 = "psk identity or DHM size too long or SSL buffer too short";
          iVar17 = 0xa8a;
          goto LAB_001778b8;
        }
        uStackY_1b0 = sVar23 + 8;
        ssl->out_msg[sVar23 + 6] = mbedtls_sha1.total[0]._1_1_;
        ssl->out_msg[sVar23 + 7] = (uchar)mbedtls_sha1.total[0];
        pmVar44 = ssl->handshake;
        sVar23 = mbedtls_mpi_size(&(pmVar44->dhm_ctx).P);
        iVar17 = mbedtls_dhm_make_public
                           (&pmVar44->dhm_ctx,(int)sVar23,ssl->out_msg + uStackY_1b0,
                            (size_t)mbedtls_sha1.total,ssl->conf->f_rng,ssl->conf->p_rng);
        if (iVar17 != 0) {
          pcVar37 = "mbedtls_dhm_make_public";
          iVar16 = 0xa97;
          goto LAB_0017912d;
        }
        break;
      case MBEDTLS_KEY_EXCHANGE_RSA_PSK:
        iVar17 = ssl_write_encrypted_pms(ssl,uStackY_1b0,(size_t *)&mbedtls_sha1,2);
        if (iVar17 != 0) {
          return iVar17;
        }
        break;
      case MBEDTLS_KEY_EXCHANGE_ECDHE_PSK:
        iVar17 = mbedtls_ecdh_make_public
                           (&ssl->handshake->ecdh_ctx,(size_t *)&mbedtls_sha1,
                            ssl->out_msg + uStackY_1b0,0x3ffa - sVar23,pmVar4->f_rng,pmVar4->p_rng);
        if (iVar17 != 0) {
          pcVar37 = "mbedtls_ecdh_make_public";
          iVar16 = 0xaa8;
          goto LAB_0017912d;
        }
        mbedtls_debug_print_ecp
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0xaac,"ECDH: Q",&(ssl->handshake->ecdh_ctx).Q);
      }
      iVar17 = mbedtls_ssl_psk_derive_premaster(ssl,pmVar27->key_exchange);
      if (iVar17 != 0) {
        pcVar37 = "mbedtls_ssl_psk_derive_premaster";
        iVar16 = 0xab8;
        goto LAB_0017912d;
      }
      break;
    default:
      iVar17 = 0xac9;
      goto LAB_00178029;
    }
    ssl->out_msglen = uStackY_1b0 + (long)mbedtls_sha1.total;
    ssl->out_msgtype = 0x16;
    *ssl->out_msg = '\x10';
    ssl->state = ssl->state + 1;
    iVar17 = mbedtls_ssl_write_record(ssl);
    if (iVar17 == 0) {
      pcVar37 = "<= write client key exchange";
      iVar17 = 0;
      iVar16 = 2;
      iVar18 = 0xad9;
      goto LAB_00179155;
    }
    pcVar37 = "mbedtls_ssl_write_record";
    iVar16 = 0xad5;
    goto LAB_0017912d;
  case 9:
    pmVar27 = ssl->transform_negotiate->ciphersuite_info;
    mbedtls_md5.total[0] = 0;
    mbedtls_md5.total[1] = 0;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0xb07,"=> write certificate verify");
    iVar17 = mbedtls_ssl_derive_keys(ssl);
    if (iVar17 == 0) {
      if (pmVar27->key_exchange - MBEDTLS_KEY_EXCHANGE_PSK < 4) {
        pcVar37 = "<= skip write certificate verify";
        iVar17 = 0xb14;
      }
      else {
        if ((ssl->client_auth != 0) &&
           ((((pmVar44 = ssl->handshake, pmVar44 != (mbedtls_ssl_handshake_params *)0x0 &&
              (pmVar21 = pmVar44->key_cert, pmVar21 != (mbedtls_ssl_key_cert *)0x0)) ||
             (pmVar21 = ssl->conf->key_cert, pmVar21 != (mbedtls_ssl_key_cert *)0x0)) &&
            (pmVar21->cert != (mbedtls_x509_crt *)0x0)))) {
          pmVar22 = mbedtls_ssl_own_key(ssl);
          if (pmVar22 == (mbedtls_pk_context *)0x0) {
            pcVar37 = "got no private key for certificate";
            iVar17 = 0xb22;
            goto LAB_0017794e;
          }
          hash_00 = &mbedtls_sha1;
          (*pmVar44->calc_verify)(ssl,(uchar *)hash_00);
          if (ssl->minor_ver == 3) {
            bVar50 = ssl->transform_negotiate->ciphersuite_info->mac == MBEDTLS_MD_SHA384;
            mVar35 = bVar50 | MBEDTLS_MD_SHA256;
            ssl->out_msg[4] = bVar50 | 4;
            pmVar22 = mbedtls_ssl_own_key(ssl);
            uVar12 = mbedtls_ssl_sig_from_pk(pmVar22);
            ssl->out_msg[5] = uVar12;
            lVar40 = 2;
            sVar23 = 0;
          }
          else {
            pmVar22 = mbedtls_ssl_own_key(ssl);
            mVar35 = MBEDTLS_MD_SHA1;
            iVar17 = mbedtls_pk_can_do(pmVar22,MBEDTLS_PK_ECDSA);
            if (iVar17 == 0) {
              sVar23 = 0x24;
              lVar40 = 0;
              mVar35 = MBEDTLS_MD_NONE;
            }
            else {
              sVar23 = 0x14;
              hash_00 = (mbedtls_sha1_context *)(mbedtls_sha1.state + 2);
              lVar40 = 0;
            }
          }
          pmVar22 = mbedtls_ssl_own_key(ssl);
          iVar17 = mbedtls_pk_sign(pmVar22,mVar35,(uchar *)hash_00,sVar23,ssl->out_msg + lVar40 + 6,
                                   (size_t *)&mbedtls_md5,ssl->conf->f_rng,ssl->conf->p_rng);
          if (iVar17 == 0) {
            ssl->out_msg[lVar40 + 4] = mbedtls_md5.total[0]._1_1_;
            ssl->out_msg[lVar40 + 5] = (uchar)mbedtls_md5.total[0];
            ssl->out_msglen = lVar40 + 6 + (long)mbedtls_md5.total;
            ssl->out_msgtype = 0x16;
            *ssl->out_msg = '\x0f';
            ssl->state = ssl->state + 1;
            iVar17 = mbedtls_ssl_write_record(ssl);
            if (iVar17 == 0) {
              pcVar37 = "<= write certificate verify";
              iVar17 = 0;
              iVar16 = 2;
              iVar18 = 0xb8c;
              goto LAB_00179155;
            }
            pcVar37 = "mbedtls_ssl_write_record";
            iVar16 = 0xb88;
          }
          else {
            pcVar37 = "mbedtls_pk_sign";
            iVar16 = 0xb79;
          }
          goto LAB_0017912d;
        }
        pcVar37 = "<= skip write certificate verify";
        iVar17 = 0xb1b;
      }
LAB_00177c19:
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,iVar17,pcVar37);
      ssl->state = ssl->state + 1;
      return 0;
    }
    pcVar37 = "mbedtls_ssl_derive_keys";
    iVar16 = 0xb0b;
    goto LAB_0017912d;
  case 10:
    iVar17 = mbedtls_ssl_write_change_cipher_spec(ssl);
    return iVar17;
  case 0xb:
    iVar17 = mbedtls_ssl_write_finished(ssl);
    return iVar17;
  case 0xc:
    break;
  case 0xd:
    iVar17 = mbedtls_ssl_parse_finished(ssl);
    return iVar17;
  case 0xe:
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0xc6f,"handshake: done");
    ssl->state = 0xf;
    return 0;
  case 0xf:
    mbedtls_ssl_handshake_wrapup(ssl);
    return 0;
  default:
    pcVar37 = "invalid state %d";
    iVar17 = 0xc78;
LAB_0017741a:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,iVar17,pcVar37,uVar49);
    return -0x7100;
  case 0x11:
    goto switchD_001770f1_caseD_11;
  }
  if (ssl->handshake->new_session_ticket == 0) {
    iVar17 = mbedtls_ssl_parse_change_cipher_spec(ssl);
    return iVar17;
  }
  ssl->state = 0x11;
switchD_001770f1_caseD_11:
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
             ,0xb9d,"=> parse new session ticket");
  iVar17 = mbedtls_ssl_read_record(ssl);
  if (iVar17 != 0) {
    pcVar37 = "mbedtls_ssl_read_record";
    iVar16 = 0xba1;
LAB_0017912d:
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,iVar16,pcVar37,iVar17);
    return iVar17;
  }
  if (ssl->in_msgtype != 0x16) {
    pcVar37 = "bad new session ticket message";
    iVar17 = 1;
    iVar16 = 0xba7;
LAB_00178734:
    mbedtls_debug_print_msg
              (ssl,iVar17,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,iVar16,pcVar37);
    return -0x7700;
  }
  puVar41 = ssl->in_msg;
  if (*puVar41 == '\x04') {
    uVar38 = (ulong)((ssl->conf->field_0x164 & 2) >> 1) * 8;
    uVar49 = uVar38 + 10;
    if (uVar49 <= ssl->in_hslen) {
      uVar38 = uVar38 | 4;
      uVar32 = (ulong)(ushort)(*(ushort *)(puVar41 + uVar38 + 4) << 8 |
                              *(ushort *)(puVar41 + uVar38 + 4) >> 8);
      if (uVar49 + uVar32 == ssl->in_hslen) {
        uVar20 = *(uint *)(puVar41 + uVar38);
        mbedtls_debug_print_msg
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0xbc9,"ticket length: %d",uVar32);
        ssl->handshake->new_session_ticket = 0;
        ssl->state = 0xc;
        if (uVar32 == 0) {
          return 0;
        }
        puVar25 = ssl->session_negotiate->ticket;
        sVar23 = ssl->session_negotiate->ticket_len;
        for (sVar34 = 0; sVar23 != sVar34; sVar34 = sVar34 + 1) {
          puVar25[sVar34] = '\0';
        }
        free(ssl->session_negotiate->ticket);
        pmVar8 = ssl->session_negotiate;
        puVar25 = (uchar *)calloc(1,uVar32);
        pmVar8->ticket = (uchar *)0x0;
        pmVar8->ticket_len = 0;
        if (puVar25 == (uchar *)0x0) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                     ,0xbde,"ticket alloc failed");
          return -0x7f00;
        }
        memcpy(puVar25,puVar41 + uVar38 + 6,uVar32);
        pmVar8->ticket = puVar25;
        pmVar8->ticket_len = uVar32;
        pmVar8->ticket_lifetime =
             uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 | uVar20 << 0x18;
        iVar17 = 0;
        mbedtls_debug_print_msg
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0xbed,"ticket in use, discarding session id");
        ssl->session_negotiate->id_len = 0;
        pcVar37 = "<= parse new session ticket";
        iVar16 = 2;
        iVar18 = 0xbf0;
LAB_00179155:
        mbedtls_debug_print_msg
                  (ssl,iVar16,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,iVar18,pcVar37);
        return iVar17;
      }
      iVar17 = 0xbc5;
      goto LAB_001776f7;
    }
  }
  iVar17 = 3000;
LAB_001776f7:
  mbedtls_debug_print_msg
            (ssl,1,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
             ,iVar17,"bad new session ticket message");
  return -0x6e00;
}

Assistant:

int mbedtls_ssl_handshake_client_step( mbedtls_ssl_context *ssl )
{
    int ret = 0;

    if( ssl->state == MBEDTLS_SSL_HANDSHAKE_OVER || ssl->handshake == NULL )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "client state: %d", ssl->state ) );

    if( ( ret = mbedtls_ssl_flush_output( ssl ) ) != 0 )
        return( ret );

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        ssl->handshake->retransmit_state == MBEDTLS_SSL_RETRANS_SENDING )
    {
        if( ( ret = mbedtls_ssl_resend( ssl ) ) != 0 )
            return( ret );
    }
#endif

    /* Change state now, so that it is right in mbedtls_ssl_read_record(), used
     * by DTLS for dropping out-of-sequence ChangeCipherSpec records */
#if defined(MBEDTLS_SSL_SESSION_TICKETS)
    if( ssl->state == MBEDTLS_SSL_SERVER_CHANGE_CIPHER_SPEC &&
        ssl->handshake->new_session_ticket != 0 )
    {
        ssl->state = MBEDTLS_SSL_SERVER_NEW_SESSION_TICKET;
    }
#endif

    switch( ssl->state )
    {
        case MBEDTLS_SSL_HELLO_REQUEST:
            ssl->state = MBEDTLS_SSL_CLIENT_HELLO;
            break;

       /*
        *  ==>   ClientHello
        */
       case MBEDTLS_SSL_CLIENT_HELLO:
           ret = ssl_write_client_hello( ssl );
           break;

       /*
        *  <==   ServerHello
        *        Certificate
        *      ( ServerKeyExchange  )
        *      ( CertificateRequest )
        *        ServerHelloDone
        */
       case MBEDTLS_SSL_SERVER_HELLO:
           ret = ssl_parse_server_hello( ssl );
           break;

       case MBEDTLS_SSL_SERVER_CERTIFICATE:
           ret = mbedtls_ssl_parse_certificate( ssl );
           break;

       case MBEDTLS_SSL_SERVER_KEY_EXCHANGE:
           ret = ssl_parse_server_key_exchange( ssl );
           break;

       case MBEDTLS_SSL_CERTIFICATE_REQUEST:
           ret = ssl_parse_certificate_request( ssl );
           break;

       case MBEDTLS_SSL_SERVER_HELLO_DONE:
           ret = ssl_parse_server_hello_done( ssl );
           break;

       /*
        *  ==> ( Certificate/Alert  )
        *        ClientKeyExchange
        *      ( CertificateVerify  )
        *        ChangeCipherSpec
        *        Finished
        */
       case MBEDTLS_SSL_CLIENT_CERTIFICATE:
           ret = mbedtls_ssl_write_certificate( ssl );
           break;

       case MBEDTLS_SSL_CLIENT_KEY_EXCHANGE:
           ret = ssl_write_client_key_exchange( ssl );
           break;

       case MBEDTLS_SSL_CERTIFICATE_VERIFY:
           ret = ssl_write_certificate_verify( ssl );
           break;

       case MBEDTLS_SSL_CLIENT_CHANGE_CIPHER_SPEC:
           ret = mbedtls_ssl_write_change_cipher_spec( ssl );
           break;

       case MBEDTLS_SSL_CLIENT_FINISHED:
           ret = mbedtls_ssl_write_finished( ssl );
           break;

       /*
        *  <==   ( NewSessionTicket )
        *        ChangeCipherSpec
        *        Finished
        */
#if defined(MBEDTLS_SSL_SESSION_TICKETS)
       case MBEDTLS_SSL_SERVER_NEW_SESSION_TICKET:
           ret = ssl_parse_new_session_ticket( ssl );
           break;
#endif

       case MBEDTLS_SSL_SERVER_CHANGE_CIPHER_SPEC:
           ret = mbedtls_ssl_parse_change_cipher_spec( ssl );
           break;

       case MBEDTLS_SSL_SERVER_FINISHED:
           ret = mbedtls_ssl_parse_finished( ssl );
           break;

       case MBEDTLS_SSL_FLUSH_BUFFERS:
           MBEDTLS_SSL_DEBUG_MSG( 2, ( "handshake: done" ) );
           ssl->state = MBEDTLS_SSL_HANDSHAKE_WRAPUP;
           break;

       case MBEDTLS_SSL_HANDSHAKE_WRAPUP:
           mbedtls_ssl_handshake_wrapup( ssl );
           break;

       default:
           MBEDTLS_SSL_DEBUG_MSG( 1, ( "invalid state %d", ssl->state ) );
           return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
   }

    return( ret );
}